

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UdpBodySyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::UdpBodySyntax,slang::syntax::UdpBodySyntax_const&>
          (BumpAllocator *this,UdpBodySyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  UdpBodySyntax *pUVar9;
  
  pUVar9 = (UdpBodySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UdpBodySyntax *)this->endPtr < pUVar9 + 1) {
    pUVar9 = (UdpBodySyntax *)allocateSlow(this,0xb0,8);
  }
  else {
    this->head->current = (byte *)(pUVar9 + 1);
  }
  (pUVar9->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pUVar9->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pUVar9->super_SyntaxNode).field_0x4 = uVar4;
  (pUVar9->super_SyntaxNode).parent = pSVar1;
  uVar4 = *(undefined4 *)&(args->portDecls).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->portDecls).super_SyntaxListBase.super_SyntaxNode.parent;
  (pUVar9->portDecls).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->portDecls).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pUVar9->portDecls).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pUVar9->portDecls).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pUVar9->portDecls).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->portDecls).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pUVar9->portDecls).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pUVar9->portDecls).super_SyntaxListBase.childCount =
       (args->portDecls).super_SyntaxListBase.childCount;
  (pUVar9->portDecls).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006a4f00;
  sVar2 = (args->portDecls).elements._M_extent._M_extent_value;
  (pUVar9->portDecls).elements._M_ptr = (args->portDecls).elements._M_ptr;
  (pUVar9->portDecls).elements._M_extent._M_extent_value = sVar2;
  TVar5 = (args->table).kind;
  uVar6 = (args->table).field_0x2;
  NVar7.raw = (args->table).numFlags.raw;
  uVar8 = (args->table).rawLen;
  pUVar9->initialStmt = args->initialStmt;
  (pUVar9->table).kind = TVar5;
  (pUVar9->table).field_0x2 = uVar6;
  (pUVar9->table).numFlags = (NumericTokenFlags)NVar7.raw;
  (pUVar9->table).rawLen = uVar8;
  (pUVar9->table).info = (args->table).info;
  (pUVar9->entries).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->entries).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->entries).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->entries).super_SyntaxListBase.super_SyntaxNode.parent;
  (pUVar9->entries).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->entries).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pUVar9->entries).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pUVar9->entries).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pUVar9->entries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pUVar9->entries).super_SyntaxListBase.childCount =
       (args->entries).super_SyntaxListBase.childCount;
  sVar2 = (args->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pUVar9->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_ptr =
       (args->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_ptr;
  (pUVar9->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pUVar9->entries).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a6658
  ;
  uVar6 = (args->endtable).field_0x2;
  NVar7.raw = (args->endtable).numFlags.raw;
  uVar8 = (args->endtable).rawLen;
  pIVar3 = (args->endtable).info;
  (pUVar9->endtable).kind = (args->endtable).kind;
  (pUVar9->endtable).field_0x2 = uVar6;
  (pUVar9->endtable).numFlags = (NumericTokenFlags)NVar7.raw;
  (pUVar9->endtable).rawLen = uVar8;
  (pUVar9->endtable).info = pIVar3;
  return pUVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }